

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Bool prvTidyIsCSS1Selector(ctmbstr buf)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  
  lVar6 = 0;
  bVar4 = true;
  iVar5 = 0;
  do {
    if (bVar4 == false) {
      return no;
    }
    bVar1 = buf[lVar6];
    bVar4 = true;
    iVar2 = 1;
    if (bVar1 != 0x5c) {
      if (bVar1 == 0) {
        return yes;
      }
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[bVar1] >> 0xb & 1) == 0) {
        iVar2 = 0;
        if (iVar5 < 1) {
          bVar4 = (bool)((0xa0 < bVar1 || (ulong)bVar1 == 0x2d && (int)lVar6 != 0) |
                        (byte)((*ppuVar3)[bVar1] >> 10) & 1);
        }
      }
      else {
        iVar2 = (uint)(0 < iVar5) + iVar5;
        if (iVar5 < 5) {
          bVar4 = 0 < iVar2 || (int)lVar6 != 0;
        }
        else {
          bVar4 = false;
        }
      }
    }
    iVar5 = iVar2;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

Bool TY_(IsCSS1Selector)( ctmbstr buf )
{
    Bool valid = yes;
    int esclen = 0;
    byte c;
    int pos;

    for ( pos=0; valid && (c = *buf++); ++pos )
    {
        if ( c == '\\' )
        {
            esclen = 1;  /* ab\555\444 is 4 chars {'a', 'b', \555, \444} */
        }
        else if ( isdigit( c ) )
        {
            /* Digit not 1st, unless escaped (Max length "\112F") */
            if ( esclen > 0 )
                valid = ( ++esclen < 6 );
            if ( valid )
                valid = ( pos>0 || esclen>0 );
        }
        else
        {
            valid = (
                esclen > 0                       /* Escaped? Anything goes. */
                || ( pos>0 && c == '-' )         /* Dash cannot be 1st char */
                || isalpha(c)                    /* a-z, A-Z anywhere */
                || ( c >= 161 )                  /* Unicode 161-255 anywhere */
            );
            esclen = 0;
        }
    }
    return valid;
}